

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyDefinition::IfcPropertyDefinition
          (IfcPropertyDefinition *this,void **vtt)

{
  void **vtt_local;
  IfcPropertyDefinition *this_local;
  
  IfcRoot::IfcRoot(&this->super_IfcRoot,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyDefinition,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyDefinition,_0UL> *)
             &(this->super_IfcRoot).field_0x88,vtt + 5);
  (this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper
       = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                  _vptr_ObjectHelper[-3]) = vtt[7];
  *(void **)&(this->super_IfcRoot).field_0x88 = vtt[8];
  return;
}

Assistant:

IfcPropertyDefinition() : Object("IfcPropertyDefinition") {}